

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsViewPrivate::storeDragDropEvent
          (QGraphicsViewPrivate *this,QGraphicsSceneDragDropEvent *event)

{
  long lVar1;
  QGraphicsSceneEvent *this_00;
  QEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff48;
  DropAction in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff58;
  Type type;
  QGraphicsSceneDragDropEvent *this_01;
  QFlagsStorage<Qt::DropAction> actions;
  QGraphicsSceneDragDropEvent *in_stack_ffffffffffffff60;
  
  type = (Type)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long **)(in_RDI + 0x520) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x520) + 8))();
  }
  this_00 = (QGraphicsSceneEvent *)operator_new(0x18);
  QEvent::type(in_RSI);
  QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent(in_stack_ffffffffffffff60,type);
  *(QGraphicsSceneEvent **)(in_RDI + 0x520) = this_00;
  this_01 = *(QGraphicsSceneDragDropEvent **)(in_RDI + 0x520);
  QGraphicsSceneDragDropEvent::scenePos(this_01);
  actions.i = (Int)((ulong)this_01 >> 0x20);
  QGraphicsSceneDragDropEvent::setScenePos
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QPointF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::screenPos((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setScreenPos
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QPoint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::buttons((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setButtons
            ((QGraphicsSceneDragDropEvent *)this_00,(MouseButtons)actions.i);
  QGraphicsSceneDragDropEvent::modifiers((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setModifiers
            ((QGraphicsSceneDragDropEvent *)this_00,(KeyboardModifiers)actions.i);
  QGraphicsSceneDragDropEvent::possibleActions((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setPossibleActions
            ((QGraphicsSceneDragDropEvent *)this_00,(DropActions)actions.i);
  QGraphicsSceneDragDropEvent::proposedAction((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setProposedAction
            ((QGraphicsSceneDragDropEvent *)this_00,in_stack_ffffffffffffff4c);
  QGraphicsSceneDragDropEvent::dropAction((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setDropAction
            ((QGraphicsSceneDragDropEvent *)this_00,in_stack_ffffffffffffff4c);
  QGraphicsSceneDragDropEvent::mimeData((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setMimeData
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QMimeData *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0xa352cd);
  QGraphicsSceneEvent::setWidget
            (this_00,(QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneDragDropEvent::source((QGraphicsSceneDragDropEvent *)this_00);
  QGraphicsSceneDragDropEvent::setSource
            ((QGraphicsSceneDragDropEvent *)this_00,
             (QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  QGraphicsSceneEvent::timestamp((QGraphicsSceneEvent *)0xa35323);
  QGraphicsSceneEvent::setTimestamp
            (this_00,CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::storeDragDropEvent(const QGraphicsSceneDragDropEvent *event)
{
    delete lastDragDropEvent;
    lastDragDropEvent = new QGraphicsSceneDragDropEvent(event->type());
    lastDragDropEvent->setScenePos(event->scenePos());
    lastDragDropEvent->setScreenPos(event->screenPos());
    lastDragDropEvent->setButtons(event->buttons());
    lastDragDropEvent->setModifiers(event->modifiers());
    lastDragDropEvent->setPossibleActions(event->possibleActions());
    lastDragDropEvent->setProposedAction(event->proposedAction());
    lastDragDropEvent->setDropAction(event->dropAction());
    lastDragDropEvent->setMimeData(event->mimeData());
    lastDragDropEvent->setWidget(event->widget());
    lastDragDropEvent->setSource(event->source());
    lastDragDropEvent->setTimestamp(event->timestamp());
}